

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5UnicodeIsAlnum(Unicode61Tokenizer *p,int iCode)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  u32 in_ESI;
  Unicode61Tokenizer *in_RDI;
  
  iVar2 = sqlite3Fts5UnicodeCategory(in_ESI);
  bVar1 = in_RDI->aCategory[iVar2];
  uVar3 = fts5UnicodeIsException(in_RDI,in_ESI);
  return bVar1 ^ uVar3;
}

Assistant:

static int fts5UnicodeIsAlnum(Unicode61Tokenizer *p, int iCode){
  return (
    p->aCategory[sqlite3Fts5UnicodeCategory((u32)iCode)]
    ^ fts5UnicodeIsException(p, iCode)
  );
}